

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::FastGdR2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  int v1;
  undefined4 uVar1;
  undefined4 uVar2;
  ushort uVar3;
  TcParseTableBase *pTVar4;
  bool bVar5;
  uint uVar6;
  MessageLite *pMVar7;
  ulong uVar8;
  string *psVar9;
  char *pcVar10;
  uint *puVar11;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar12;
  size_type sVar13;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar14;
  RepeatedPtrFieldBase *ptr_00;
  pointer pcVar15;
  int iVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  RepeatedPtrFieldBase local_60;
  TcParseTableBase *local_48;
  TcParseTableBase *local_40;
  RepeatedPtrFieldBase *local_38;
  
  if (data.field_0._0_2_ != 0) {
    pcVar10 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar10;
  }
  uVar3 = *(ushort *)ptr;
  pMVar7 = *(MessageLite **)
            ((long)&table->has_bits_offset +
            ((ulong)data.field_0 >> 0x18 & 0xff) * 8 + (ulong)table->aux_offset);
  local_38 = RefAt<google::protobuf::internal::RepeatedPtrFieldBase>
                       (msg,(ulong)data.field_0 >> 0x30);
  local_40 = MessageLite::GetTcParseTable(pMVar7);
  local_60.arena_._0_4_ = (uint)uVar3;
  aVar12._0_4_ = (int)(char)uVar3 + (uint)local_60.arena_ >> 1;
  aVar12.data._4_4_ = 0;
  local_48 = local_40 + 1;
  local_60.arena_._4_4_ = aVar12._0_4_;
  while( true ) {
    ptr_00 = local_38;
    pMVar7 = AddMessage(local_40,local_38);
    pTVar4 = local_48;
    auVar17._8_8_ = extraout_RDX;
    auVar17._0_8_ = local_60.tagged_rep_or_elem_;
    iVar16 = ctx->depth_;
    v1 = iVar16 + -1;
    ctx->depth_ = v1;
    if (iVar16 < 1) break;
    iVar16 = ctx->group_depth_ + 1;
    ctx->group_depth_ = iVar16;
    local_60.tagged_rep_or_elem_ =
         (RepeatedPtrFieldBase *)((long)&((RepeatedPtrFieldBase *)ptr)->tagged_rep_or_elem_ + 2);
    while( true ) {
      ptr_00 = &local_60;
      bVar5 = ParseContext::Done(ctx,(char **)&local_60);
      auVar17._8_8_ = extraout_RDX_00;
      auVar17._0_8_ = local_60.tagged_rep_or_elem_;
      if (bVar5) break;
      uVar6 = (uint)pTVar4[-1].fast_idx_mask &
              (uint)*(ushort *)(void **)local_60.tagged_rep_or_elem_;
      if ((uVar6 & 7) != 0) goto LAB_00144a94;
      uVar8 = (ulong)(uVar6 & 0xfffffff8);
      aVar12.data = (ulong)*(ushort *)(void **)local_60.tagged_rep_or_elem_ ^
                    *(ulong *)(&pTVar4->fast_idx_mask + uVar8 * 2);
      auVar17 = (**(code **)(&pTVar4->has_bits_offset + uVar8))
                          (pMVar7,local_60.tagged_rep_or_elem_,ctx,aVar12.data,pTVar4 + -1,0);
      ptr_00 = (RepeatedPtrFieldBase *)local_60.tagged_rep_or_elem_;
      if ((auVar17._0_8_ == (RepeatedPtrFieldBase *)0x0) ||
         (local_60.tagged_rep_or_elem_ = auVar17._0_8_,
         (ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0)) break;
    }
    local_60.tagged_rep_or_elem_ = auVar17._0_8_;
    ptr = (char *)local_60.tagged_rep_or_elem_;
    if ((pTVar4[-1].field_0x9 & 1) != 0) {
      ptr_00 = (RepeatedPtrFieldBase *)local_60.tagged_rep_or_elem_;
      auVar18 = (undefined1  [16])
                (*pTVar4[-1].post_loop_handler)(pMVar7,(char *)local_60.tagged_rep_or_elem_,ctx);
      auVar17._8_8_ = auVar18._8_8_;
      auVar17._0_8_ = local_60.tagged_rep_or_elem_;
      ptr = (char *)auVar18._0_8_;
    }
    local_60.tagged_rep_or_elem_ = auVar17._0_8_;
    if ((RepeatedPtrFieldBase *)ptr != (RepeatedPtrFieldBase *)0x0) {
      psVar9 = absl::lts_20240722::log_internal::Check_EQImpl_abi_cxx11_
                         (v1,ctx->depth_,"old_depth == depth_");
      if (psVar9 != (string *)0x0) {
        pcVar15 = (psVar9->_M_dataplus)._M_p;
        sVar13 = psVar9->_M_string_length;
        uVar14 = 0x45b;
LAB_00144ae4:
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_60,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/parse_context.h"
                   ,uVar14,sVar13,pcVar15);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_60);
      }
      ptr_00 = (RepeatedPtrFieldBase *)(ulong)(uint)ctx->group_depth_;
      psVar9 = absl::lts_20240722::log_internal::Check_EQImpl_abi_cxx11_
                         (iVar16,ctx->group_depth_,"old_group_depth == group_depth_");
      auVar17._8_8_ = extraout_RDX_01;
      auVar17._0_8_ = local_60.tagged_rep_or_elem_;
      if (psVar9 != (string *)0x0) {
        pcVar15 = (psVar9->_M_dataplus)._M_p;
        sVar13 = psVar9->_M_string_length;
        uVar14 = 0x45c;
        goto LAB_00144ae4;
      }
    }
    local_60.tagged_rep_or_elem_ = auVar17._0_8_;
    uVar6 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
    (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
    uVar1 = ctx->depth_;
    uVar2 = ctx->group_depth_;
    ctx->depth_ = uVar1 + 1;
    ctx->group_depth_ = uVar2 + -1;
    if (((RepeatedPtrFieldBase *)ptr == (RepeatedPtrFieldBase *)0x0) ||
       (uVar6 != local_60.arena_._4_4_)) break;
    if ((RepeatedPtrFieldBase *)(ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar11 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
        *puVar11 = *puVar11 | (uint)hasbits;
      }
      return (char *)(RepeatedPtrFieldBase *)ptr;
    }
    uVar3 = *(ushort *)&((RepeatedPtrFieldBase *)ptr)->tagged_rep_or_elem_;
    aVar12.data._2_6_ = 0;
    aVar12.data._0_2_ = uVar3;
    if (uVar3 != (ushort)local_60.arena_) {
      uVar6 = (uint)table->fast_idx_mask & (uint)uVar3;
      if ((uVar6 & 7) == 0) {
        uVar8 = (ulong)(uVar6 & 0xfffffff8);
        pcVar10 = (char *)(**(code **)(&table[1].has_bits_offset + uVar8))
                                    (msg,ptr,ctx,
                                     aVar12.data ^ *(ulong *)(&table[1].fast_idx_mask + uVar8 * 2),
                                     table,hasbits);
        return pcVar10;
      }
LAB_00144a94:
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x44d);
    }
  }
  local_60.tagged_rep_or_elem_ = auVar17._0_8_;
  pcVar10 = Error(msg,(char *)ptr_00,auVar17._8_8_,(TcFieldData)aVar12,table,hasbits);
  return pcVar10;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastGdR2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedParseMessageAuxImpl<uint16_t, true, false>(
      PROTOBUF_TC_PARAM_PASS);
}